

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-Z.cpp
# Opt level: O1

bool __thiscall
baryonyx::itm::
solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>
::local_affect<baryonyx::bit_array,baryonyx::sparse_matrix<int>::row_value*>
          (solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>
           *this,bit_array *x,row_value *it,int k,int selected,int r_size,double kappa,double delta)

{
  double dVar1;
  int iVar2;
  double dVar3;
  bool bVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  
  lVar6 = (long)k;
  lVar5 = *(long *)(this + 0x78);
  dVar10 = *(double *)(lVar5 + lVar6 * 8);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = dVar10;
  dVar3 = kappa / (1.0 - kappa) + delta;
  if (selected < 0) {
    *(double *)(lVar5 + lVar6 * 8) = dVar10 + **(double **)(this + 0x60) * 0.5;
    if (r_size != 0) {
      lVar5 = 0;
      do {
        iVar2 = *(int *)(*(long *)(this + 0x60) + 8 + lVar5);
        bit_array_impl::unset(&x->super_bit_array_impl,it[iVar2].column);
        *(double *)(*(long *)(this + 0x50) + (long)it[iVar2].value * 8) =
             *(double *)(*(long *)(this + 0x50) + (long)it[iVar2].value * 8) - dVar3;
        dVar10 = solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>
                 ::local_compute_reduced_cost<baryonyx::bit_array>
                           ((solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>
                             *)this,it[iVar2].column,x);
        if (dVar10 <= 0.0) {
          *(double *)(*(long *)(this + 0x50) + (long)it[iVar2].value * 8) =
               (dVar10 + *(double *)(*(long *)(this + 0x50) + (long)it[iVar2].value * 8)) - dVar3;
        }
        lVar5 = lVar5 + 0x10;
      } while ((ulong)(uint)r_size << 4 != lVar5);
    }
  }
  else {
    uVar7 = selected + 1;
    dVar1 = *(double *)(*(long *)(this + 0x60) + (ulong)(uint)selected * 0x10);
    auVar11._8_8_ = 0;
    auVar11._0_8_ = dVar1;
    if ((int)uVar7 < r_size) {
      *(double *)(lVar5 + lVar6 * 8) =
           dVar10 + (dVar1 + *(double *)(*(long *)(this + 0x60) + (ulong)uVar7 * 0x10)) * 0.5;
      lVar5 = 8;
      uVar9 = 0;
      do {
        iVar2 = *(int *)(*(long *)(this + 0x60) + lVar5);
        bit_array_impl::set(&x->super_bit_array_impl,it[iVar2].column);
        *(double *)(*(long *)(this + 0x50) + (long)it[iVar2].value * 8) =
             dVar3 + *(double *)(*(long *)(this + 0x50) + (long)it[iVar2].value * 8);
        dVar10 = solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>
                 ::local_compute_reduced_cost<baryonyx::bit_array>
                           ((solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>
                             *)this,it[iVar2].column,x);
        if (0.0 <= dVar10) {
          *(double *)(*(long *)(this + 0x50) + (long)it[iVar2].value * 8) =
               (*(double *)(*(long *)(this + 0x50) + (long)it[iVar2].value * 8) - dVar10) + dVar3;
        }
        uVar9 = uVar9 + 1;
        lVar5 = lVar5 + 0x10;
      } while (uVar7 != uVar9);
      if (r_size != (int)uVar9) {
        lVar8 = (uint)r_size - uVar9;
        do {
          iVar2 = *(int *)(*(long *)(this + 0x60) + lVar5);
          bit_array_impl::unset(&x->super_bit_array_impl,it[iVar2].column);
          *(double *)(*(long *)(this + 0x50) + (long)it[iVar2].value * 8) =
               *(double *)(*(long *)(this + 0x50) + (long)it[iVar2].value * 8) - dVar3;
          dVar10 = solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>
                   ::local_compute_reduced_cost<baryonyx::bit_array>
                             ((solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>
                               *)this,it[iVar2].column,x);
          if (dVar10 <= 0.0) {
            *(double *)(*(long *)(this + 0x50) + (long)it[iVar2].value * 8) =
                 (dVar10 + *(double *)(*(long *)(this + 0x50) + (long)it[iVar2].value * 8)) - dVar3;
          }
          lVar5 = lVar5 + 0x10;
          lVar8 = lVar8 + -1;
        } while (lVar8 != 0);
      }
    }
    else {
      auVar11 = vfmadd132sd_fma(auVar11,auVar12,ZEXT816(0x3ff8000000000000));
      *(long *)(lVar5 + lVar6 * 8) = auVar11._0_8_;
      if (r_size != 0) {
        lVar5 = 0;
        do {
          iVar2 = *(int *)(*(long *)(this + 0x60) + 8 + lVar5);
          bit_array_impl::set(&x->super_bit_array_impl,it[iVar2].column);
          *(double *)(*(long *)(this + 0x50) + (long)it[iVar2].value * 8) =
               dVar3 + *(double *)(*(long *)(this + 0x50) + (long)it[iVar2].value * 8);
          dVar10 = solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>
                   ::local_compute_reduced_cost<baryonyx::bit_array>
                             ((solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>
                               *)this,it[iVar2].column,x);
          if (0.0 <= dVar10) {
            *(double *)(*(long *)(this + 0x50) + (long)it[iVar2].value * 8) =
                 (*(double *)(*(long *)(this + 0x50) + (long)it[iVar2].value * 8) - dVar10) + dVar3;
          }
          lVar5 = lVar5 + 0x10;
        } while ((ulong)(uint)r_size << 4 != lVar5);
      }
    }
  }
  bVar4 = is_valid_constraint<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>,baryonyx::bit_array>
                    ((solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>
                      *)this,k,x);
  if (!bVar4) {
    local_affect<baryonyx::bit_array,baryonyx::sparse_matrix<int>::row_value*>();
  }
  uVar7 = vmovmskpd_avx(auVar12);
  return (bool)((byte)((byte)(((ulong)uVar7 << 0x3f) >> 0x38) ^
                      (byte)((ulong)*(undefined8 *)(*(long *)(this + 0x78) + lVar6 * 8) >> 0x38)) >>
               7);
}

Assistant:

bool local_affect(Xtype& x,
                      Iterator it,
                      int k,
                      int selected,
                      int r_size,
                      const Float kappa,
                      const Float delta)
    {
        constexpr Float one{ 1 };
        constexpr Float two{ 2 };
        constexpr Float middle{ (two + one) / two };

        const auto old_pi = pi[k];

        auto d = (kappa / (one - kappa)) + delta;

        if (selected < 0) {
            pi[k] += R[0].value / two;

            logger::log("    selected: {}/{} ({})/2 = pi {}\n",
                        selected,
                        r_size,
                        R[0].value,
                        pi[k]);

            for (int i = 0; i != r_size; ++i) {
                auto var = it + R[i].id;

                x.unset(var->column);
                P[var->value] -= d;

                auto repair = local_compute_reduced_cost(var->column, x);
                if (repair <= 0)
                    P[var->value] = P[var->value] + repair - d;
            }
        } else if (selected + 1 >= r_size) {
            pi[k] += R[selected].value * middle;

            logger::log("    selected: {}/{} ({})/2 = pi {}\n",
                        selected,
                        r_size,
                        R[selected].value,
                        pi[k]);

            for (int i = 0; i != r_size; ++i) {
                auto var = it + R[i].id;

                x.set(var->column);
                P[var->value] += d;

                auto repair = local_compute_reduced_cost(var->column, x);
                if (repair >= 0)
                    P[var->value] = P[var->value] - repair + d;
            }
        } else {
            pi[k] += ((R[selected].value + R[selected + 1].value) / two);

            logger::log("    selected: {}/{} ({}x{})/2 = pi {}\n",
                        selected,
                        r_size,
                        R[selected].value,
                        R[selected + 1].value,
                        pi[k]);

            int i = 0;
            for (; i <= selected; ++i) {
                auto var = it + R[i].id;

                x.set(var->column);
                P[var->value] += d;

                auto repair = local_compute_reduced_cost(var->column, x);
                if (repair >= 0)
                    P[var->value] = P[var->value] - repair + d;
            }

            for (; i != r_size; ++i) {
                auto var = it + R[i].id;

                x.unset(var->column);
                P[var->value] -= d;

                auto repair = local_compute_reduced_cost(var->column, x);
                if (repair <= 0)
                    P[var->value] = P[var->value] + repair - d;
            }
        }

        // TODO job: develops is_valid_constraint for all the solvers
        bx_expects(is_valid_constraint(*this, k, x));

        return is_signbit_change(old_pi, pi[k]);
    }